

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O0

pair<double_*,_bool> __thiscall
HighsHashTree<std::pair<int,_int>,_double>::InnerLeaf<1>::insert_entry
          (InnerLeaf<1> *this,uint64_t fullHash,int hashPos,Entry *entry)

{
  uint8_t pos_00;
  bool bVar1;
  uint16_t chunks;
  reference pvVar2;
  reference pvVar3;
  HighsHashTableEntry<std::pair<int,_int>,_double> *in_RCX;
  int in_EDX;
  uint64_t in_RSI;
  InnerLeaf<1> *in_RDI;
  pair<double_*,_bool> pVar4;
  int pos;
  uint8_t hashChunk;
  uint16_t hash;
  undefined7 in_stack_ffffffffffffff58;
  uint8_t in_stack_ffffffffffffff5f;
  array<HighsHashTableEntry<std::pair<int,_int>,_double>,_6UL> *in_stack_ffffffffffffff60;
  int *in_stack_ffffffffffffff70;
  uint16_t *in_stack_ffffffffffffff78;
  InnerLeaf<1> *in_stack_ffffffffffffff88;
  int local_38;
  double *local_10;
  undefined1 local_8;
  
  chunks = get_hash_chunks16(in_RSI,in_EDX);
  pos_00 = get_first_chunk16(chunks);
  local_38 = Occupation::num_set_until
                       ((Occupation *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5f);
  bVar1 = Occupation::test(&in_RDI->occupation,pos_00);
  if (bVar1) {
    local_38 = local_38 + -1;
    while (pvVar2 = std::array<unsigned_long,_7UL>::operator[]
                              ((array<unsigned_long,_7UL> *)in_stack_ffffffffffffff60,
                               CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58)),
          (ulong)chunks < *pvVar2) {
      local_38 = local_38 + 1;
    }
    HighsHashTableEntry<std::pair<int,_int>,_double>::key(in_RCX);
    bVar1 = find_key(in_stack_ffffffffffffff88,(pair<int,_int> *)in_RDI,in_stack_ffffffffffffff78,
                     in_stack_ffffffffffffff70);
    if (bVar1) {
      pvVar3 = std::array<HighsHashTableEntry<std::pair<int,_int>,_double>,_6UL>::operator[]
                         (in_stack_ffffffffffffff60,
                          CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      HighsHashTableEntry<std::pair<int,_int>,_double>::value(pvVar3);
      pVar4 = std::make_pair<double*,bool>
                        ((double **)in_stack_ffffffffffffff60,
                         (bool *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      local_8 = pVar4.second;
      goto LAB_0073a210;
    }
  }
  else {
    Occupation::set(&in_RDI->occupation,pos_00);
    if (local_38 < in_RDI->size) {
      while (pvVar2 = std::array<unsigned_long,_7UL>::operator[]
                                ((array<unsigned_long,_7UL> *)in_stack_ffffffffffffff60,
                                 CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58)),
            (ulong)chunks < *pvVar2) {
        local_38 = local_38 + 1;
      }
    }
  }
  if (local_38 < in_RDI->size) {
    move_backward(in_RDI,(int *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  }
  std::array<HighsHashTableEntry<std::pair<int,_int>,_double>,_6UL>::operator[]
            ((array<HighsHashTableEntry<std::pair<int,_int>,_double>,_6UL> *)in_RCX,
             CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  HighsHashTableEntry<std::pair<int,_int>,_double>::operator=
            (in_RCX,(HighsHashTableEntry<std::pair<int,_int>,_double> *)
                    CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  pvVar2 = std::array<unsigned_long,_7UL>::operator[]
                     ((array<unsigned_long,_7UL> *)in_RCX,
                      CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  *pvVar2 = (ulong)chunks;
  in_RDI->size = in_RDI->size + 1;
  pvVar2 = std::array<unsigned_long,_7UL>::operator[]
                     ((array<unsigned_long,_7UL> *)in_RCX,
                      CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  *pvVar2 = 0;
  pvVar3 = std::array<HighsHashTableEntry<std::pair<int,_int>,_double>,_6UL>::operator[]
                     ((array<HighsHashTableEntry<std::pair<int,_int>,_double>,_6UL> *)in_RCX,
                      CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  HighsHashTableEntry<std::pair<int,_int>,_double>::value(pvVar3);
  pVar4 = std::make_pair<double*,bool>
                    ((double **)in_RCX,
                     (bool *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  local_8 = pVar4.second;
LAB_0073a210:
  local_10 = pVar4.first;
  pVar4.second = (bool)local_8;
  pVar4.first = local_10;
  return pVar4;
}

Assistant:

std::pair<ValueType*, bool> insert_entry(uint64_t fullHash, int hashPos,
                                             Entry& entry) {
      assert(size < capacity());
      uint16_t hash = get_hash_chunks16(fullHash, hashPos);
      uint8_t hashChunk = get_first_chunk16(hash);

      int pos = occupation.num_set_until(hashChunk);

      if (occupation.test(hashChunk)) {
        // since the occupation flag is set we need to start searching from
        // pos-1 and can rely on a hash chunk with the same value existing for
        // the scan
        --pos;
        while (hashes[pos] > hash) ++pos;

        if (find_key(entry.key(), hash, pos))
          return std::make_pair(&entries[pos].value(), false);

      } else {
        occupation.set(hashChunk);

        if (pos < size)
          while (hashes[pos] > hash) ++pos;
      }

      if (pos < size) move_backward(pos, size);
      entries[pos] = std::move(entry);
      hashes[pos] = hash;
      ++size;
      hashes[size] = 0;

      return std::make_pair(&entries[pos].value(), true);
    }